

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DPIImportSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DPIImportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,
          FunctionPrototypeSyntax *args_6,Token *args_7)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  TokenKind TVar19;
  undefined1 uVar20;
  NumericTokenFlags NVar21;
  uint32_t uVar22;
  TokenKind TVar23;
  undefined1 uVar24;
  NumericTokenFlags NVar25;
  uint32_t uVar26;
  TokenKind TVar27;
  undefined1 uVar28;
  NumericTokenFlags NVar29;
  uint32_t uVar30;
  DPIImportSyntax *this_00;
  
  this_00 = (DPIImportSyntax *)allocate(this,0xb8,8);
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar11 = args_2->kind;
  uVar12 = args_2->field_0x2;
  NVar13.raw = (args_2->numFlags).raw;
  uVar14 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar15 = args_3->kind;
  uVar16 = args_3->field_0x2;
  NVar17.raw = (args_3->numFlags).raw;
  uVar18 = args_3->rawLen;
  pIVar3 = args_3->info;
  TVar19 = args_4->kind;
  uVar20 = args_4->field_0x2;
  NVar21.raw = (args_4->numFlags).raw;
  uVar22 = args_4->rawLen;
  pIVar4 = args_4->info;
  TVar23 = args_5->kind;
  uVar24 = args_5->field_0x2;
  NVar25.raw = (args_5->numFlags).raw;
  uVar26 = args_5->rawLen;
  pIVar5 = args_5->info;
  TVar27 = args_7->kind;
  uVar28 = args_7->field_0x2;
  NVar29.raw = (args_7->numFlags).raw;
  uVar30 = args_7->rawLen;
  pIVar6 = args_7->info;
  slang::syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,DPIImport,args);
  (this_00->keyword).kind = TVar7;
  (this_00->keyword).field_0x2 = uVar8;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar9.raw;
  (this_00->keyword).rawLen = uVar10;
  (this_00->keyword).info = pIVar1;
  (this_00->specString).kind = TVar11;
  (this_00->specString).field_0x2 = uVar12;
  (this_00->specString).numFlags = (NumericTokenFlags)NVar13.raw;
  (this_00->specString).rawLen = uVar14;
  (this_00->specString).info = pIVar2;
  (this_00->property).kind = TVar15;
  (this_00->property).field_0x2 = uVar16;
  (this_00->property).numFlags = (NumericTokenFlags)NVar17.raw;
  (this_00->property).rawLen = uVar18;
  (this_00->property).info = pIVar3;
  (this_00->c_identifier).kind = TVar19;
  (this_00->c_identifier).field_0x2 = uVar20;
  (this_00->c_identifier).numFlags = (NumericTokenFlags)NVar21.raw;
  (this_00->c_identifier).rawLen = uVar22;
  (this_00->c_identifier).info = pIVar4;
  (this_00->equals).kind = TVar23;
  (this_00->equals).field_0x2 = uVar24;
  (this_00->equals).numFlags = (NumericTokenFlags)NVar25.raw;
  (this_00->equals).rawLen = uVar26;
  (this_00->equals).info = pIVar5;
  (this_00->method).ptr = args_6;
  (this_00->semi).kind = TVar27;
  (this_00->semi).field_0x2 = uVar28;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar29.raw;
  (this_00->semi).rawLen = uVar30;
  (this_00->semi).info = pIVar6;
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }